

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VaultClient.h
# Opt level: O0

Token * __thiscall Vault::Client::getToken_abi_cxx11_(Token *__return_storage_ptr__,Client *this)

{
  Client *this_local;
  
  Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(__return_storage_ptr__,
         (Tiny<Vault::TokenDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)(this + 0x50));
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] virtual Token getToken() const { return token_; }